

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseJsonName
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  string *output;
  undefined1 local_78 [8];
  LocationRecorder location;
  allocator local_51;
  string local_50;
  FileDescriptorProto *local_30;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *field_location_local;
  FieldDescriptorProto *field_local;
  Parser *this_local;
  
  local_30 = containing_file;
  containing_file_local = (FileDescriptorProto *)field_location;
  field_location_local = (LocationRecorder *)field;
  field_local = (FieldDescriptorProto *)this;
  bVar1 = FieldDescriptorProto::has_json_name(field);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"Already set option \"json_name\".",&local_51);
    AddError(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    FieldDescriptorProto::clear_json_name((FieldDescriptorProto *)field_location_local);
  }
  bVar1 = Consume(this,"json_name");
  if (bVar1) {
    bVar1 = Consume(this,"=");
    if (bVar1) {
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)local_78,(LocationRecorder *)containing_file_local,10);
      LocationRecorder::RecordLegacyLocation
                ((LocationRecorder *)local_78,(Message *)field_location_local,OPTION_VALUE);
      output = FieldDescriptorProto::mutable_json_name_abi_cxx11_
                         ((FieldDescriptorProto *)field_location_local);
      this_local._7_1_ = ConsumeString(this,output,"Expected string for JSON name.");
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_78);
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseJsonName(
    FieldDescriptorProto* field,
    const LocationRecorder& field_location,
    const FileDescriptorProto* containing_file) {
  if (field->has_json_name()) {
    AddError("Already set option \"json_name\".");
    field->clear_json_name();
  }

  DO(Consume("json_name"));
  DO(Consume("="));

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kJsonNameFieldNumber);
  location.RecordLegacyLocation(
      field, DescriptorPool::ErrorCollector::OPTION_VALUE);
  DO(ConsumeString(field->mutable_json_name(),
                   "Expected string for JSON name."));
  return true;
}